

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgstrs.c
# Opt level: O1

void cgstrs(trans_t trans,SuperMatrix *L,SuperMatrix *U,int *perm_c,int *perm_r,SuperMatrix *B,
           SuperLUStat_t *stat,int *info)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int *piVar10;
  singlecomplex *psVar11;
  void *pvVar12;
  long lVar13;
  void *pvVar14;
  long lVar15;
  bool bVar16;
  long lVar17;
  singlecomplex *Mxvec;
  singlecomplex *addr;
  long lVar18;
  ulong uVar19;
  long lVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  singlecomplex *psVar24;
  uint uVar25;
  long lVar26;
  int iVar27;
  ulong uVar28;
  int iVar29;
  ulong uVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  ulong uVar34;
  float fVar35;
  int ii;
  
  *info = 0;
  piVar10 = (int *)B->Store;
  iVar6 = *piVar10;
  lVar17 = (long)iVar6;
  uVar7 = B->ncol;
  uVar34 = (ulong)uVar7;
  iVar21 = -1;
  if (trans < (CONJ|TRANS)) {
    iVar27 = L->nrow;
    iVar21 = -2;
    if ((((-1 < iVar27) && (iVar27 == L->ncol)) && (L->Stype == SLU_SC)) &&
       ((L->Dtype == SLU_C && (L->Mtype == SLU_TRLU)))) {
      iVar21 = -3;
      if (((-1 < U->nrow) && ((U->nrow == U->ncol && (U->Stype == SLU_NC)))) &&
         ((U->Dtype == SLU_C &&
          ((((U->Mtype == SLU_TRU && (iVar21 = -6, iVar27 <= iVar6)) && (B->Stype == SLU_DN)) &&
           ((B->Dtype == SLU_C && (B->Mtype == SLU_GE)))))))) goto LAB_00112f29;
    }
  }
  *info = iVar21;
LAB_00112f29:
  if (*info == 0) {
    uVar8 = L->nrow;
    uVar30 = (ulong)uVar8;
    Mxvec = singlecomplexCalloc((long)(int)uVar7 * (long)(int)uVar8);
    if (Mxvec == (singlecomplex *)0x0) {
      sprintf((char *)&ii,"%s at line %d in file %s\n","Malloc fails for local work[].",0x8d,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/cgstrs.c");
      superlu_abort_and_exit((char *)&ii);
    }
    addr = singlecomplexMalloc((long)(int)uVar8);
    if (addr == (singlecomplex *)0x0) {
      sprintf((char *)&ii,"%s at line %d in file %s\n","Malloc fails for local soln[].",0x8f,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/cgstrs.c");
      superlu_abort_and_exit((char *)&ii);
    }
    psVar11 = *(singlecomplex **)(piVar10 + 2);
    if (trans == NOTRANS) {
      pvVar12 = L->Store;
      lVar13 = *(long *)((long)pvVar12 + 8);
      pvVar14 = U->Store;
      lVar15 = *(long *)((long)pvVar14 + 8);
      if (0 < (int)uVar7) {
        uVar19 = 0;
        psVar24 = psVar11;
        do {
          if (0 < (int)uVar8) {
            uVar28 = 0;
            do {
              addr[perm_r[uVar28]] = psVar24[uVar28];
              uVar28 = uVar28 + 1;
            } while (uVar30 != uVar28);
          }
          if (0 < (int)uVar8) {
            uVar28 = 0;
            do {
              psVar24[uVar28] = addr[uVar28];
              uVar28 = uVar28 + 1;
            } while (uVar30 != uVar28);
          }
          uVar19 = uVar19 + 1;
          psVar24 = psVar24 + lVar17;
        } while (uVar19 != uVar34);
      }
      uVar25 = *(uint *)((long)pvVar12 + 4);
      if ((int)uVar25 < 0) {
        fVar35 = 0.0;
      }
      else {
        fVar35 = 0.0;
        lVar18 = 0;
        do {
          lVar33 = (long)*(int *)(*(long *)((long)pvVar12 + 0x30) + lVar18 * 4);
          uVar25 = *(uint *)(*(long *)((long)pvVar12 + 0x20) + lVar33 * 4);
          iVar6 = *(int *)(*(long *)((long)pvVar12 + 0x20) + 4 + lVar33 * 4);
          iVar29 = iVar6 - uVar25;
          lVar22 = *(int *)(*(long *)((long)pvVar12 + 0x30) + 4 + lVar18 * 4) - lVar33;
          iVar21 = (int)lVar22;
          iVar27 = iVar29 - iVar21;
          if (iVar21 == 1) {
            if (0 < (int)uVar7) {
              lVar22 = lVar13 + 0xc +
                       (long)*(int *)(*(long *)((long)pvVar12 + 0x10) + lVar33 * 4) * 8;
              uVar30 = 0;
              do {
                if ((int)(uVar25 + 1) < iVar6) {
                  lVar31 = uVar30 * lVar17;
                  lVar20 = *(long *)((long)pvVar12 + 0x18);
                  lVar32 = 0;
                  do {
                    lVar26 = (long)*(int *)(lVar20 + (long)(int)uVar25 * 4 + 4 + lVar32 * 4);
                    fVar1 = psVar11[lVar31 + lVar33].r;
                    fVar2 = psVar11[lVar31 + lVar33].i;
                    fVar3 = *(float *)(lVar22 + -4 + lVar32 * 8);
                    fVar4 = *(float *)(lVar22 + lVar32 * 8);
                    fVar5 = psVar11[lVar31 + lVar26].i;
                    psVar11[lVar31 + lVar26].r =
                         psVar11[lVar31 + lVar26].r - (fVar1 * fVar3 - fVar4 * fVar2);
                    psVar11[lVar31 + lVar26].i = fVar5 - (fVar2 * fVar3 + fVar1 * fVar4);
                    lVar32 = lVar32 + 1;
                  } while (~uVar25 + iVar6 != (int)lVar32);
                }
                uVar30 = uVar30 + 1;
              } while (uVar30 != uVar34);
            }
          }
          else if (0 < (int)uVar7) {
            lVar20 = (long)*(int *)(*(long *)((long)pvVar12 + 0x10) + lVar33 * 4);
            uVar30 = 0;
            do {
              lVar31 = uVar30 * lVar17;
              clsolve(iVar29,iVar21,(singlecomplex *)(lVar13 + lVar20 * 8),psVar11 + lVar31 + lVar33
                     );
              cmatvec(iVar29,iVar27,iVar21,(singlecomplex *)(lVar13 + (lVar22 + lVar20) * 8),
                      psVar11 + lVar31 + lVar33,Mxvec);
              if (0 < iVar27) {
                lVar32 = *(long *)((long)pvVar12 + 0x18);
                lVar26 = 0;
                do {
                  lVar23 = (long)*(int *)(lVar32 + (long)(int)(uVar25 + iVar21) * 4 + lVar26 * 4);
                  fVar1 = psVar11[lVar31 + lVar23].i;
                  psVar11[lVar31 + lVar23].r = psVar11[lVar31 + lVar23].r - Mxvec[lVar26].r;
                  psVar11[lVar31 + lVar23].i = fVar1 - Mxvec[lVar26].i;
                  Mxvec[lVar26].r = 0.0;
                  Mxvec[lVar26].i = 0.0;
                  lVar26 = lVar26 + 1;
                } while (lVar26 < iVar27);
              }
              uVar30 = uVar30 + 1;
            } while (uVar30 != uVar34);
          }
          fVar35 = (float)(int)(uVar7 * 8 * iVar21 * iVar27) +
                   fVar35 + (float)(int)(uVar7 * 4 * iVar21 * (iVar21 + -1));
          uVar25 = *(uint *)((long)pvVar12 + 4);
          bVar16 = lVar18 < (int)uVar25;
          lVar18 = lVar18 + 1;
        } while (bVar16);
      }
      if (-1 < (int)uVar25) {
        uVar30 = (ulong)uVar25;
        do {
          iVar6 = *(int *)(*(long *)((long)pvVar12 + 0x30) + uVar30 * 4);
          lVar22 = (long)iVar6;
          iVar21 = *(int *)(*(long *)((long)pvVar12 + 0x30) + 4 + uVar30 * 4);
          iVar27 = iVar21 - iVar6;
          lVar18 = (long)*(int *)(*(long *)((long)pvVar12 + 0x10) + lVar22 * 4);
          if (iVar27 == 1) {
            if (0 < (int)uVar7) {
              psVar24 = psVar11 + lVar22;
              uVar19 = uVar34;
              do {
                c_div(psVar24,psVar24,(singlecomplex *)(lVar13 + lVar18 * 8));
                psVar24 = psVar24 + lVar17;
                uVar25 = (int)uVar19 - 1;
                uVar19 = (ulong)uVar25;
              } while (uVar25 != 0);
            }
          }
          else if (0 < (int)uVar7) {
            iVar29 = *(int *)(*(long *)((long)pvVar12 + 0x20) + 4 + lVar22 * 4);
            iVar9 = *(int *)(*(long *)((long)pvVar12 + 0x20) + lVar22 * 4);
            psVar24 = psVar11 + lVar22;
            uVar19 = uVar34;
            do {
              cusolve(iVar29 - iVar9,iVar27,(singlecomplex *)(lVar13 + lVar18 * 8),psVar24);
              psVar24 = psVar24 + lVar17;
              uVar19 = uVar19 - 1;
            } while (uVar19 != 0);
          }
          fVar35 = fVar35 + (float)(int)((iVar27 + 1) * uVar7 * 4 * iVar27);
          if (0 < (int)uVar7) {
            uVar19 = 0;
            do {
              if (iVar6 < iVar21) {
                lVar20 = uVar19 * lVar17;
                lVar18 = *(long *)((long)pvVar14 + 0x18);
                lVar33 = lVar22;
                do {
                  iVar27 = *(int *)(lVar18 + 4 + lVar33 * 4);
                  iVar29 = *(int *)(lVar18 + lVar33 * 4);
                  lVar31 = (long)iVar29;
                  if (iVar27 - iVar29 != 0 && iVar29 <= iVar27) {
                    lVar32 = *(long *)((long)pvVar14 + 0x10);
                    do {
                      lVar26 = (long)*(int *)(lVar32 + lVar31 * 4);
                      fVar1 = psVar11[lVar20 + lVar33].r;
                      fVar2 = psVar11[lVar20 + lVar33].i;
                      fVar3 = *(float *)(lVar15 + lVar31 * 8);
                      fVar4 = *(float *)(lVar15 + 4 + lVar31 * 8);
                      fVar5 = psVar11[lVar20 + lVar26].i;
                      psVar11[lVar20 + lVar26].r =
                           psVar11[lVar20 + lVar26].r - (fVar1 * fVar3 - fVar4 * fVar2);
                      psVar11[lVar20 + lVar26].i = fVar5 - (fVar2 * fVar3 + fVar1 * fVar4);
                      lVar31 = lVar31 + 1;
                    } while (iVar27 != lVar31);
                  }
                  lVar33 = lVar33 + 1;
                  fVar35 = fVar35 + (float)((iVar27 - iVar29) * 8);
                } while (lVar33 != iVar21);
              }
              uVar19 = uVar19 + 1;
            } while (uVar19 != uVar34);
          }
          bVar16 = 0 < (long)uVar30;
          uVar30 = uVar30 - 1;
        } while (bVar16);
      }
      if (0 < (int)uVar7) {
        uVar30 = 0;
        psVar24 = psVar11;
        do {
          if (0 < (int)uVar8) {
            uVar19 = 0;
            do {
              addr[uVar19] = psVar11[uVar30 * lVar17 + (long)perm_c[uVar19]];
              uVar19 = uVar19 + 1;
            } while (uVar8 != uVar19);
          }
          if (0 < (int)uVar8) {
            uVar19 = 0;
            do {
              psVar24[uVar19] = addr[uVar19];
              uVar19 = uVar19 + 1;
            } while (uVar8 != uVar19);
          }
          uVar30 = uVar30 + 1;
          psVar24 = psVar24 + lVar17;
        } while (uVar30 != uVar34);
      }
      stat->ops[0x11] = fVar35;
    }
    else {
      if (0 < (int)uVar7) {
        uVar19 = 0;
        psVar24 = psVar11;
        do {
          if (0 < (int)uVar8) {
            uVar28 = 0;
            do {
              addr[perm_c[uVar28]] = psVar24[uVar28];
              uVar28 = uVar28 + 1;
            } while (uVar30 != uVar28);
          }
          if (0 < (int)uVar8) {
            uVar28 = 0;
            do {
              psVar24[uVar28] = addr[uVar28];
              uVar28 = uVar28 + 1;
            } while (uVar30 != uVar28);
          }
          uVar19 = uVar19 + 1;
          psVar24 = psVar24 + lVar17;
        } while (uVar19 != uVar34);
      }
      stat->ops[0x11] = 0.0;
      if (trans == TRANS) {
        psVar24 = psVar11;
        uVar19 = uVar34;
        if (0 < (int)uVar7) {
          do {
            sp_ctrsv("U","T","N",L,U,psVar24,stat,info);
            sp_ctrsv("L","T","U",L,U,psVar24,stat,info);
            uVar19 = uVar19 - 1;
            psVar24 = psVar24 + lVar17;
          } while (uVar19 != 0);
        }
      }
      else {
        psVar24 = psVar11;
        uVar19 = uVar34;
        if (0 < (int)uVar7) {
          do {
            sp_ctrsv("U","C","N",L,U,psVar24,stat,info);
            sp_ctrsv("L","C","U",L,U,psVar24,stat,info);
            uVar19 = uVar19 - 1;
            psVar24 = psVar24 + lVar17;
          } while (uVar19 != 0);
        }
      }
      if (0 < (int)uVar7) {
        uVar19 = 0;
        psVar24 = psVar11;
        do {
          if (0 < (int)uVar8) {
            uVar28 = 0;
            do {
              addr[uVar28] = psVar11[uVar19 * lVar17 + (long)perm_r[uVar28]];
              uVar28 = uVar28 + 1;
            } while (uVar30 != uVar28);
          }
          if (0 < (int)uVar8) {
            uVar28 = 0;
            do {
              psVar24[uVar28] = addr[uVar28];
              uVar28 = uVar28 + 1;
            } while (uVar30 != uVar28);
          }
          uVar19 = uVar19 + 1;
          psVar24 = psVar24 + lVar17;
        } while (uVar19 != uVar34);
      }
    }
    superlu_free(Mxvec);
    superlu_free(addr);
  }
  else {
    ii = -*info;
    input_error("cgstrs",&ii);
  }
  return;
}

Assistant:

void
cgstrs (trans_t trans, SuperMatrix *L, SuperMatrix *U,
        const int *perm_c, const int *perm_r, SuperMatrix *B,
        SuperLUStat_t *stat, int *info)
{

#ifdef _CRAY
    _fcd ftcs1, ftcs2, ftcs3, ftcs4;
#endif
#ifdef USE_VENDOR_BLAS
    singlecomplex   alpha = {1.0, 0.0}, beta = {1.0, 0.0};
    singlecomplex   *work_col;
#endif
    singlecomplex   temp_comp;
    DNformat *Bstore;
    singlecomplex   *Bmat;
    SCformat *Lstore;
    NCformat *Ustore;
    singlecomplex   *Lval, *Uval;
    int      fsupc, nrow, nsupr, nsupc, irow;
    int_t    i, j, k, luptr, istart, iptr;
    int      jcol, n, ldb, nrhs;
    singlecomplex   *work, *rhs_work, *soln;
    flops_t  solve_ops;
    void cprint_soln(int n, int nrhs, const singlecomplex *soln);

    /* Test input parameters ... */
    *info = 0;
    Bstore = B->Store;
    ldb = Bstore->lda;
    nrhs = B->ncol;
    if ( trans != NOTRANS && trans != TRANS && trans != CONJ ) *info = -1;
    else if ( L->nrow != L->ncol || L->nrow < 0 ||
	      L->Stype != SLU_SC || L->Dtype != SLU_C || L->Mtype != SLU_TRLU )
	*info = -2;
    else if ( U->nrow != U->ncol || U->nrow < 0 ||
	      U->Stype != SLU_NC || U->Dtype != SLU_C || U->Mtype != SLU_TRU )
	*info = -3;
    else if ( ldb < SUPERLU_MAX(0, L->nrow) ||
	      B->Stype != SLU_DN || B->Dtype != SLU_C || B->Mtype != SLU_GE )
	*info = -6;
    if ( *info ) {
	int ii = -(*info);
	input_error("cgstrs", &ii);
	return;
    }

    n = L->nrow;
    work = singlecomplexCalloc((size_t) n * (size_t) nrhs);
    if ( !work ) ABORT("Malloc fails for local work[].");
    soln = singlecomplexMalloc((size_t) n);
    if ( !soln ) ABORT("Malloc fails for local soln[].");

    Bmat = Bstore->nzval;
    Lstore = L->Store;
    Lval = Lstore->nzval;
    Ustore = U->Store;
    Uval = Ustore->nzval;
    solve_ops = 0;
    
    if ( trans == NOTRANS ) {
	/* Permute right hand sides to form Pr*B */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[perm_r[k]] = rhs_work[k];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}
	
	/* Forward solve PLy=Pb. */
	for (k = 0; k <= Lstore->nsuper; k++) {
	    fsupc = L_FST_SUPC(k);
	    istart = L_SUB_START(fsupc);
	    nsupr = L_SUB_START(fsupc+1) - istart;
	    nsupc = L_FST_SUPC(k+1) - fsupc;
	    nrow = nsupr - nsupc;

	    solve_ops += 4 * nsupc * (nsupc - 1) * nrhs;
	    solve_ops += 8 * nrow * nsupc * nrhs;
	    
	    if ( nsupc == 1 ) {
		for (j = 0; j < nrhs; j++) {
		    rhs_work = &Bmat[(size_t)j * (size_t)ldb];
	    	    luptr = L_NZ_START(fsupc);
		    for (iptr=istart+1; iptr < L_SUB_START(fsupc+1); iptr++){
			irow = L_SUB(iptr);
			++luptr;
			cc_mult(&temp_comp, &rhs_work[fsupc], &Lval[luptr]);
			c_sub(&rhs_work[irow], &rhs_work[irow], &temp_comp);
		    }
		}
	    } else {
	    	luptr = L_NZ_START(fsupc);
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		ftcs1 = _cptofcd("L", strlen("L"));
		ftcs2 = _cptofcd("N", strlen("N"));
		ftcs3 = _cptofcd("U", strlen("U"));
		CTRSM( ftcs1, ftcs1, ftcs2, ftcs3, &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
		
		CGEMM( ftcs2, ftcs2, &nrow, &nrhs, &nsupc, &alpha, 
			&Lval[luptr+nsupc], &nsupr, &Bmat[fsupc], &ldb, 
			&beta, &work[0], &n );
#else
		ctrsm_("L", "L", "N", "U", &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
		
		cgemm_( "N", "N", &nrow, &nrhs, &nsupc, &alpha, 
			&Lval[luptr+nsupc], &nsupr, &Bmat[fsupc], &ldb, 
			&beta, &work[0], &n );
#endif
		for (j = 0; j < nrhs; j++) {
		    rhs_work = &Bmat[(size_t)j * (size_t)ldb];
		    work_col = &work[(size_t)j * (size_t)n];
		    iptr = istart + nsupc;
		    for (i = 0; i < nrow; i++) {
			irow = L_SUB(iptr);
			c_sub(&rhs_work[irow], &rhs_work[irow], &work_col[i]);
			work_col[i].r = 0.0;
	                work_col[i].i = 0.0;
			iptr++;
		    }
		}
#else		
		for (j = 0; j < nrhs; j++) {
		    rhs_work = &Bmat[(size_t)j * (size_t)ldb];
		    clsolve (nsupr, nsupc, &Lval[luptr], &rhs_work[fsupc]);
		    cmatvec (nsupr, nrow, nsupc, &Lval[luptr+nsupc],
			    &rhs_work[fsupc], &work[0] );

		    iptr = istart + nsupc;
		    for (i = 0; i < nrow; i++) {
			irow = L_SUB(iptr);
			c_sub(&rhs_work[irow], &rhs_work[irow], &work[i]);
			work[i].r = 0.;
	                work[i].i = 0.;
			iptr++;
		    }
		}
#endif		    
	    } /* else ... */
	} /* for L-solve */

#if ( DEBUGlevel>=2 )
  	printf("After L-solve: y=\n");
	cprint_soln(n, nrhs, Bmat);
#endif

	/*
	 * Back solve Ux=y.
	 */
	for (k = Lstore->nsuper; k >= 0; k--) {
	    fsupc = L_FST_SUPC(k);
	    istart = L_SUB_START(fsupc);
	    nsupr = L_SUB_START(fsupc+1) - istart;
	    nsupc = L_FST_SUPC(k+1) - fsupc;
	    luptr = L_NZ_START(fsupc);

	    solve_ops += 4 * nsupc * (nsupc + 1) * nrhs;

	    if ( nsupc == 1 ) {
		rhs_work = &Bmat[0];
		for (j = 0; j < nrhs; j++) {
		    c_div(&rhs_work[fsupc], &rhs_work[fsupc], &Lval[luptr]);
		    rhs_work += ldb;
		}
	    } else {
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		ftcs1 = _cptofcd("L", strlen("L"));
		ftcs2 = _cptofcd("U", strlen("U"));
		ftcs3 = _cptofcd("N", strlen("N"));
		CTRSM( ftcs1, ftcs2, ftcs3, ftcs3, &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
#else
		ctrsm_("L", "U", "N", "N", &nsupc, &nrhs, &alpha,
		       &Lval[luptr], &nsupr, &Bmat[fsupc], &ldb);
#endif
#else		
		for (j = 0; j < nrhs; j++)
		    cusolve ( nsupr, nsupc, &Lval[luptr], &Bmat[(size_t)fsupc + (size_t)j * (size_t)ldb] );
#endif		
	    }

	    for (j = 0; j < nrhs; ++j) {
		rhs_work = &Bmat[(size_t)j * (size_t)ldb];
		for (jcol = fsupc; jcol < fsupc + nsupc; jcol++) {
		    solve_ops += 8*(U_NZ_START(jcol+1) - U_NZ_START(jcol));
		    for (i = U_NZ_START(jcol); i < U_NZ_START(jcol+1); i++ ){
			irow = U_SUB(i);
			cc_mult(&temp_comp, &rhs_work[jcol], &Uval[i]);
			c_sub(&rhs_work[irow], &rhs_work[irow], &temp_comp);
		    }
		}
	    }
	    
	} /* for U-solve */

#if ( DEBUGlevel>=2 )
  	printf("After U-solve: x=\n");
	cprint_soln(n, nrhs, Bmat);
#endif

	/* Compute the final solution X := Pc*X. */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[k] = rhs_work[perm_c[k]];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}
	
        stat->ops[SOLVE] = solve_ops;

    } else { /* Solve A'*X=B or CONJ(A)*X=B */
	/* Permute right hand sides to form Pc'*B. */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[perm_c[k]] = rhs_work[k];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}

	stat->ops[SOLVE] = 0;
        if (trans == TRANS) {
	    for (k = 0; k < nrhs; ++k) {
	        /* Multiply by inv(U'). */
	        sp_ctrsv("U", "T", "N", L, U, &Bmat[(size_t)k * (size_t)ldb], stat, info);
	    
	        /* Multiply by inv(L'). */
	        sp_ctrsv("L", "T", "U", L, U, &Bmat[(size_t)k * (size_t)ldb], stat, info);
	    }
         } else { /* trans == CONJ */
            for (k = 0; k < nrhs; ++k) {                
                /* Multiply by conj(inv(U')). */
                sp_ctrsv("U", "C", "N", L, U, &Bmat[(size_t)k * (size_t)ldb], stat, info);
                
                /* Multiply by conj(inv(L')). */
                sp_ctrsv("L", "C", "U", L, U, &Bmat[(size_t)k * (size_t)ldb], stat, info);
	    }
         }
	/* Compute the final solution X := Pr'*X (=inv(Pr)*X) */
	for (i = 0; i < nrhs; i++) {
	    rhs_work = &Bmat[(size_t)i * (size_t)ldb];
	    for (k = 0; k < n; k++) soln[k] = rhs_work[perm_r[k]];
	    for (k = 0; k < n; k++) rhs_work[k] = soln[k];
	}

    }

    SUPERLU_FREE(work);
    SUPERLU_FREE(soln);
}